

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::CoreMLModels::WordTagger::_InternalParse
          (WordTagger *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint32_t uVar2;
  StringVector *msg;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar4;
  char cVar5;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = ptr;
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_48);
    if (bVar1) {
      return local_48;
    }
    local_48 = google::protobuf::internal::ReadTag(local_48,&local_3c,0);
    tag_00 = local_3c;
    uVar4 = local_3c >> 3;
    cVar5 = (char)local_3c;
    switch(uVar4) {
    case 0x14:
      if (cVar5 != -0x5e) goto LAB_00252ffe;
      psVar3 = _internal_mutable_tokensoutputfeaturename_abi_cxx11_(this);
      break;
    case 0x15:
      if (cVar5 != -0x56) goto LAB_00252ffe;
      psVar3 = _internal_mutable_tokentagsoutputfeaturename_abi_cxx11_(this);
      break;
    case 0x16:
      if (cVar5 != -0x4e) goto LAB_00252ffe;
      psVar3 = _internal_mutable_tokenlocationsoutputfeaturename_abi_cxx11_(this);
      break;
    case 0x17:
      if (cVar5 != -0x46) goto LAB_00252ffe;
      psVar3 = _internal_mutable_tokenlengthsoutputfeaturename_abi_cxx11_(this);
      break;
    default:
      if (uVar4 == 200) {
        if (cVar5 == 'B') {
          msg = _internal_mutable_stringtags(this);
          local_48 = google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,local_48);
          goto joined_r0x0025302e;
        }
LAB_00252ffe:
        if ((local_3c == 0) || ((local_3c & 7) == 4)) {
          if (local_48 == (char *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
          return local_48;
        }
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields<std::__cxx11::string>(local_38);
        local_48 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
      }
      else {
        if (uVar4 == 10) {
          if (cVar5 == 'R') {
            psVar3 = _internal_mutable_language_abi_cxx11_(this);
            break;
          }
          goto LAB_00252ffe;
        }
        if (uVar4 == 100) {
          if (cVar5 != '\"') goto LAB_00252ffe;
          psVar3 = _internal_mutable_modelparameterdata_abi_cxx11_(this);
          local_48 = google::protobuf::internal::InlineGreedyStringParser(psVar3,local_48,ctx);
        }
        else {
          if ((uVar4 != 1) || (cVar5 != '\b')) goto LAB_00252ffe;
          uVar2 = google::protobuf::internal::ReadVarint32(&local_48);
          this->revision_ = uVar2;
        }
      }
      goto joined_r0x0025302e;
    }
    local_48 = google::protobuf::internal::InlineGreedyStringParser(psVar3,local_48,ctx);
    bVar1 = google::protobuf::internal::VerifyUTF8(psVar3,(char *)0x0);
    if (!bVar1) {
      return (char *)0x0;
    }
joined_r0x0025302e:
    if (local_48 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* WordTagger::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint32 revision = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          revision_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string language = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_language();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokensOutputFeatureName = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_tokensoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokenTagsOutputFeatureName = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          auto str = _internal_mutable_tokentagsoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokenLocationsOutputFeatureName = 22;
      case 22:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 178)) {
          auto str = _internal_mutable_tokenlocationsoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string tokenLengthsOutputFeatureName = 23;
      case 23:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 186)) {
          auto str = _internal_mutable_tokenlengthsoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bytes modelParameterData = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          auto str = _internal_mutable_modelparameterdata();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringTags = 200;
      case 200:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringtags(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}